

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O0

void __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::destruct_all
          (pool_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_> *this)

{
  size_t sVar1;
  void **ppvVar2;
  make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *t;
  refcount_t *refcount;
  char *chunk;
  void *block_end;
  void *block;
  pool_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_> *this_local;
  
  block_end = this->_block_head;
  do {
    if (block_end == (void *)0x0) {
      free_all(this);
      return;
    }
    sVar1 = this->_block_size;
    for (refcount = (refcount_t *)first_chunk_ptr(block_end);
        (refcount != (refcount_t *)((long)block_end + sVar1) &&
        ((refcount < this->_raw_head || (this->_raw_end <= refcount))));
        refcount = (refcount_t *)(this->_alloc_size + (long)refcount)) {
      if (*refcount != 0xffffffffffffffff) {
        if (*refcount != 0) {
          __assert_fail("*refcount == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/pool.hh"
                        ,0x10b,
                        "void tchecker::pool_t<tchecker::make_shared_t<tchecker::zg::state_t>>::destruct_all() [T = tchecker::make_shared_t<tchecker::zg::state_t>]"
                       );
        }
        *refcount = 0xffffffffffffffff;
        make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>::destruct
                  ((make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)(refcount + 1));
      }
    }
    ppvVar2 = nextblock(block_end);
    block_end = *ppvVar2;
  } while( true );
}

Assistant:

void destruct_all()
  {
    // Call destructor on all chunks in blocks list that
    // - are not in free list
    // - are not in raw block
    for (void * block = _block_head; block != nullptr; block = nextblock(block)) {
      void * block_end = static_cast<char *>(block) + _block_size;

      for (char * chunk = first_chunk_ptr(block); chunk != block_end; chunk += _alloc_size) {
        // Ignore chunks inside unused raw block
        if ((_raw_head <= chunk) && (chunk < _raw_end))
          break;

        // Destruct all chunks that are not free
        typename T::refcount_t * refcount = reinterpret_cast<typename T::refcount_t *>(chunk);

        if (*refcount > T::REFCOUNT_MAX)
          continue;

        assert(*refcount == 0);
        // make the chunk free using its refcount
        *refcount = FREE_CHUNK;
        // destruct the object in the chunk
        T * t = reinterpret_cast<T *>(refcount + 1);
        T::destruct(t); // t->~T();
      }
    }

    // Free memory
    free_all();
  }